

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O1

int hpke_key_schedule(EVP_HPKE_CTX *ctx,uint8_t mode,uint8_t *shared_secret,size_t shared_secret_len
                     ,uint8_t *info,size_t info_len)

{
  int iVar1;
  EVP_MD *md;
  EVP_AEAD *aead;
  size_t sVar2;
  undefined4 extraout_var;
  uint8_t suite_id [10];
  size_t secret_len;
  size_t context_len;
  uint8_t *local_218;
  size_t local_210;
  size_t info_hash_len;
  size_t psk_id_hash_len;
  CBB context_cbb;
  uint8_t secret [64];
  uint8_t info_hash [64];
  uint8_t psk_id_hash [64];
  uint8_t key [80];
  uint8_t context [129];
  
  iVar1 = hpke_build_suite_id(ctx,suite_id);
  if (iVar1 != 0) {
    local_218 = shared_secret;
    local_210 = shared_secret_len;
    md = (EVP_MD *)(*ctx->kdf->hkdf_md_func)();
    iVar1 = hpke_labeled_extract
                      ((EVP_MD *)md,psk_id_hash,&psk_id_hash_len,(uint8_t *)0x0,0,suite_id,10,
                       "psk_id_hash",(uint8_t *)0x0,0);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = hpke_labeled_extract
                      ((EVP_MD *)md,info_hash,&info_hash_len,(uint8_t *)0x0,0,suite_id,10,
                       "info_hash",info,info_len);
    if (iVar1 == 0) {
      return 0;
    }
    CBB_init_fixed(&context_cbb,context,0x81);
    iVar1 = CBB_add_u8(&context_cbb,mode);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = CBB_add_bytes(&context_cbb,psk_id_hash,psk_id_hash_len);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = CBB_add_bytes(&context_cbb,info_hash,info_hash_len);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = CBB_finish(&context_cbb,(uint8_t **)0x0,&context_len);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = hpke_labeled_extract
                      ((EVP_MD *)md,secret,&secret_len,local_218,local_210,suite_id,10,"secret",
                       (uint8_t *)0x0,0);
    if (iVar1 != 0) {
      aead = (*ctx->aead->aead_func)();
      sVar2 = EVP_AEAD_key_length(aead);
      iVar1 = hpke_labeled_expand((EVP_MD *)md,key,sVar2,secret,secret_len,suite_id,10,"key",context
                                  ,context_len);
      if (iVar1 != 0) {
        iVar1 = EVP_AEAD_CTX_init(&ctx->aead_ctx,aead,key,sVar2,0,(ENGINE *)0x0);
        if (iVar1 == 0) {
          return 0;
        }
        sVar2 = EVP_AEAD_nonce_length(aead);
        iVar1 = hpke_labeled_expand((EVP_MD *)md,ctx->base_nonce,sVar2,secret,secret_len,suite_id,10
                                    ,"base_nonce",context,context_len);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = EVP_MD_size(md);
        iVar1 = hpke_labeled_expand((EVP_MD *)md,ctx->exporter_secret,CONCAT44(extraout_var,iVar1),
                                    secret,secret_len,suite_id,10,"exp",context,context_len);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int hpke_key_schedule(EVP_HPKE_CTX *ctx, uint8_t mode,
                             const uint8_t *shared_secret,
                             size_t shared_secret_len, const uint8_t *info,
                             size_t info_len) {
  uint8_t suite_id[HPKE_SUITE_ID_LEN];
  if (!hpke_build_suite_id(ctx, suite_id)) {
    return 0;
  }

  // psk_id_hash = LabeledExtract("", "psk_id_hash", psk_id)
  // TODO(davidben): Precompute this value and store it with the EVP_HPKE_KDF.
  const EVP_MD *hkdf_md = ctx->kdf->hkdf_md_func();
  uint8_t psk_id_hash[EVP_MAX_MD_SIZE];
  size_t psk_id_hash_len;
  if (!hpke_labeled_extract(hkdf_md, psk_id_hash, &psk_id_hash_len, NULL, 0,
                            suite_id, sizeof(suite_id), "psk_id_hash", NULL,
                            0)) {
    return 0;
  }

  // info_hash = LabeledExtract("", "info_hash", info)
  uint8_t info_hash[EVP_MAX_MD_SIZE];
  size_t info_hash_len;
  if (!hpke_labeled_extract(hkdf_md, info_hash, &info_hash_len, NULL, 0,
                            suite_id, sizeof(suite_id), "info_hash", info,
                            info_len)) {
    return 0;
  }

  // key_schedule_context = concat(mode, psk_id_hash, info_hash)
  uint8_t context[sizeof(uint8_t) + 2 * EVP_MAX_MD_SIZE];
  size_t context_len;
  CBB context_cbb;
  CBB_init_fixed(&context_cbb, context, sizeof(context));
  if (!CBB_add_u8(&context_cbb, mode) ||
      !CBB_add_bytes(&context_cbb, psk_id_hash, psk_id_hash_len) ||
      !CBB_add_bytes(&context_cbb, info_hash, info_hash_len) ||
      !CBB_finish(&context_cbb, NULL, &context_len)) {
    return 0;
  }

  // secret = LabeledExtract(shared_secret, "secret", psk)
  uint8_t secret[EVP_MAX_MD_SIZE];
  size_t secret_len;
  if (!hpke_labeled_extract(hkdf_md, secret, &secret_len, shared_secret,
                            shared_secret_len, suite_id, sizeof(suite_id),
                            "secret", NULL, 0)) {
    return 0;
  }

  // key = LabeledExpand(secret, "key", key_schedule_context, Nk)
  const EVP_AEAD *aead = EVP_HPKE_AEAD_aead(ctx->aead);
  uint8_t key[EVP_AEAD_MAX_KEY_LENGTH];
  const size_t kKeyLen = EVP_AEAD_key_length(aead);
  if (!hpke_labeled_expand(hkdf_md, key, kKeyLen, secret, secret_len, suite_id,
                           sizeof(suite_id), "key", context, context_len) ||
      !EVP_AEAD_CTX_init(&ctx->aead_ctx, aead, key, kKeyLen,
                         EVP_AEAD_DEFAULT_TAG_LENGTH, NULL)) {
    return 0;
  }

  // base_nonce = LabeledExpand(secret, "base_nonce", key_schedule_context, Nn)
  if (!hpke_labeled_expand(hkdf_md, ctx->base_nonce,
                           EVP_AEAD_nonce_length(aead), secret, secret_len,
                           suite_id, sizeof(suite_id), "base_nonce", context,
                           context_len)) {
    return 0;
  }

  // exporter_secret = LabeledExpand(secret, "exp", key_schedule_context, Nh)
  if (!hpke_labeled_expand(hkdf_md, ctx->exporter_secret, EVP_MD_size(hkdf_md),
                           secret, secret_len, suite_id, sizeof(suite_id),
                           "exp", context, context_len)) {
    return 0;
  }

  return 1;
}